

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O0

void test_1d_static<1ul>(void)

{
  int iVar1;
  ulong uVar2;
  value_type vVar3;
  size_type sVar4;
  int *local_60;
  int *local_58;
  size_type local_50;
  int local_48;
  int local_44;
  int i;
  int dptr [1];
  size_type local_38;
  unsigned_long local_30;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_10;
  bool local_f;
  bool local_e;
  bool local_d;
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
  local_c [2];
  layout_mapping_left<dimensions<1UL>,_dimensions<1>,_dimensions<0>_> l;
  
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
  ::layout_mapping_regular_precomputed_strides(local_c);
  local_d = std::experimental::detail::
            layout_mapping_regular_base<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::is_regular();
  local_e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x1d,"void test_1d_static() [X = 1UL]",&local_d,&local_e);
  local_f = std::experimental::detail::
            layout_mapping_regular_base<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::is_dynamic_stride(0);
  local_10 = false;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x1f,"void test_1d_static() [X = 1UL]",&local_f,&local_10);
  local_18 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
             ::stride(local_c,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x21,"void test_1d_static() [X = 1UL]",&local_18,&local_1c);
  local_28 = std::experimental::dimensions<1UL>::size((dimensions<1UL> *)local_c);
  local_30 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x23,"void test_1d_static() [X = 1UL]",&local_28,&local_30);
  local_38 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
             ::span(&local_c[0].
                     super_layout_mapping_regular_base<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
                   );
  _i = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x24,"void test_1d_static() [X = 1UL]",&local_38,(unsigned_long *)&i);
  local_48 = 0;
  while( true ) {
    uVar2 = (ulong)local_48;
    vVar3 = std::experimental::dimensions<1UL>::operator[]<int>((dimensions<1UL> *)local_c,0);
    if (vVar3 <= uVar2) break;
    local_50 = std::experimental::
               layout_mapping_regular_precomputed_strides<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
               ::index<int>(local_c,local_48);
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x2b,"void test_1d_static() [X = 1UL]",&local_50,&local_48);
    sVar4 = std::experimental::
            layout_mapping_regular_precomputed_strides<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::index<int>(local_c,local_48);
    local_58 = &local_44 + sVar4;
    local_60 = &local_44 + local_48;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x2d,"void test_1d_static() [X = 1UL]",&local_58,&local_60);
    iVar1 = local_48;
    sVar4 = std::experimental::
            layout_mapping_regular_precomputed_strides<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::index<int>(local_c,local_48);
    (&local_44)[sVar4] = iVar1;
    sVar4 = std::experimental::
            layout_mapping_regular_precomputed_strides<std::experimental::dimensions<1UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::index<int>(local_c,local_48);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
               ,0x31,"void test_1d_static() [X = 1UL]",&local_44 + sVar4,&local_48);
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    int dptr[X];

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 
    }
}